

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall duckdb::DatabaseInstance::CreateMainDatabase(DatabaseInstance *this)

{
  DBConfigOptions *options_00;
  StorageOptions options_01;
  optional_ptr<duckdb::AttachedDatabase,_true> this_00;
  type fs;
  pointer this_01;
  type context;
  optional_ptr<duckdb::ClientContext,_true> context_00;
  optional_ptr<duckdb::AttachedDatabase,_true> initial_database;
  Connection con;
  AttachInfo info;
  AttachOptions options;
  optional_ptr<duckdb::AttachedDatabase,_true> local_1d0;
  Connection local_1c8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  undefined1 local_180 [16];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [32];
  float local_110;
  undefined1 local_108 [16];
  OnCreateConflict local_f8;
  AttachOptions local_f0;
  
  local_180[8] = ATTACH_INFO;
  local_180._0_8_ = &PTR__AttachInfo_0197bc68;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  local_150._M_p = (pointer)&local_140;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_130._0_8_ = local_108 + 8;
  local_130._8_8_ = 1;
  local_130._16_16_ = (undefined1  [16])0x0;
  local_110 = 1.0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = ERROR_ON_CONFLICT;
  local_170._M_p = (pointer)&local_160;
  fs = unique_ptr<duckdb::DatabaseFileSystem,_std::default_delete<duckdb::DatabaseFileSystem>,_true>
       ::operator*(&this->db_file_system);
  options_00 = &(this->config).options;
  AttachedDatabase::ExtractDatabaseName
            ((string *)&local_f0,&options_00->database_path,(FileSystem *)fs);
  ::std::__cxx11::string::operator=((string *)&local_170,(string *)&local_f0);
  if ((pointer)local_f0._0_8_ != (pointer)((long)&local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_);
  }
  ::std::__cxx11::string::_M_assign((string *)&local_150);
  local_1d0.ptr = (AttachedDatabase *)0x0;
  Connection::Connection(&local_1c8,this);
  Connection::BeginTransaction(&local_1c8);
  AttachOptions::AttachOptions(&local_f0,options_00);
  this_01 = unique_ptr<duckdb::DatabaseManager,_std::default_delete<duckdb::DatabaseManager>,_true>
            ::operator->(&this->db_manager);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_1c8.context);
  local_1d0 = DatabaseManager::AttachDatabase(this_01,context,(AttachInfo *)local_180,&local_f0);
  optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_1d0);
  (local_1d0.ptr)->is_initial_database = true;
  optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_1d0);
  this_00.ptr = local_1d0.ptr;
  context_00.ptr = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_1c8.context);
  local_188 = 0;
  local_1a8 = 0xffffffff;
  uStack_1a4 = 0xffffffff;
  uStack_1a0 = 0xffffffff;
  uStack_19c = 0xffffffff;
  local_198 = 0xffffffff;
  uStack_194 = 0xffffffff;
  uStack_190 = 0xffffffff;
  uStack_18c = 0xffffffff;
  options_01.row_group_size.index = 0xffffffffffffffff;
  options_01.block_alloc_size.index = 0xffffffffffffffff;
  options_01.storage_version.index = 0xffffffffffffffff;
  options_01.block_header_size.index = 0xffffffffffffffff;
  options_01._32_8_ = 0;
  AttachedDatabase::Initialize(this_00.ptr,context_00,options_01);
  Connection::Commit(&local_1c8);
  if (local_f0.default_table.name._M_dataplus._M_p != (pointer)((long)&local_f0 + 0xb0U)) {
    operator_delete(local_f0.default_table.name._M_dataplus._M_p);
  }
  if (local_f0.default_table.schema._M_dataplus._M_p != (pointer)((long)&local_f0 + 0x90)) {
    operator_delete(local_f0.default_table.schema._M_dataplus._M_p);
  }
  if (local_f0.default_table.catalog._M_dataplus._M_p != (pointer)((long)&local_f0 + 0x70)) {
    operator_delete(local_f0.default_table.catalog._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&local_f0 + 0x28));
  if (local_f0.db_type._M_dataplus._M_p != (pointer)((long)&local_f0 + 0x18)) {
    operator_delete(local_f0.db_type._M_dataplus._M_p);
  }
  Connection::~Connection(&local_1c8);
  local_180._0_8_ = &PTR__AttachInfo_0197bc68;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != &local_140) {
    operator_delete(local_150._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p);
  }
  return;
}

Assistant:

void DatabaseInstance::CreateMainDatabase() {
	AttachInfo info;
	info.name = AttachedDatabase::ExtractDatabaseName(config.options.database_path, GetFileSystem());
	info.path = config.options.database_path;

	optional_ptr<AttachedDatabase> initial_database;
	Connection con(*this);
	con.BeginTransaction();
	AttachOptions options(config.options);
	initial_database = db_manager->AttachDatabase(*con.context, info, options);

	initial_database->SetInitialDatabase();
	initial_database->Initialize(*con.context);
	con.Commit();
}